

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

void duckdb::EntropyFun::GetFunctions(void)

{
  long in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_1b1;
  LogicalType local_1b0 [24];
  LogicalType local_198 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_180;
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  AggregateFunction local_148;
  
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"entropy","");
  duckdb::AggregateFunctionSet::AggregateFunctionSet();
  if (local_168[0] != local_158) {
    operator_delete(local_168[0]);
  }
  duckdb::LogicalType::LogicalType(local_198,ANY);
  __l._M_len = 1;
  __l._M_array = local_198;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_180,__l,&local_1b1);
  duckdb::LogicalType::LogicalType(local_1b0,DOUBLE);
  AggregateFunction::AggregateFunction
            (&local_148,(vector<duckdb::LogicalType,_true> *)&local_180,local_1b0,
             (aggregate_size_t)0x0,(aggregate_initialize_t)0x0,(aggregate_update_t)0x0,
             (aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,
             BindEntropyAggregate,(aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,
             (aggregate_window_t)0x0,(aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
             (in_RDI + 0x20),&local_148);
  local_148._0_8_ = &PTR__AggregateFunction_00897e98;
  if (local_148.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_148.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_1b0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_180);
  duckdb::LogicalType::~LogicalType(local_198);
  return;
}

Assistant:

AggregateFunctionSet EntropyFun::GetFunctions() {
	AggregateFunctionSet entropy("entropy");
	entropy.AddFunction(AggregateFunction({LogicalTypeId::ANY}, LogicalType::DOUBLE, nullptr, nullptr, nullptr, nullptr,
	                                      nullptr, nullptr, BindEntropyAggregate));
	return entropy;
}